

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.cpp
# Opt level: O0

double * numerary::Numerary::linear_regression(double *X,double *Y,int *n)

{
  double *pdVar1;
  double *ab;
  double E_X2;
  double E_XY;
  double E_Y;
  double E_X;
  int i;
  int *n_local;
  double *Y_local;
  double *X_local;
  
  E_Y = 0.0;
  E_XY = 0.0;
  E_X2 = 0.0;
  ab = (double *)0x0;
  pdVar1 = (double *)operator_new__(0x10);
  for (E_X._4_4_ = 0; E_X._4_4_ < *n; E_X._4_4_ = E_X._4_4_ + 1) {
    E_Y = X[E_X._4_4_] + E_Y;
    ab = (double *)(X[E_X._4_4_] * X[E_X._4_4_] + (double)ab);
    E_XY = Y[E_X._4_4_] + E_XY;
    E_X2 = X[E_X._4_4_] * Y[E_X._4_4_] + E_X2;
  }
  *pdVar1 = ((double)*n * E_X2 + -(E_Y * E_XY)) / ((double)*n * (double)ab + -(E_Y * E_Y));
  pdVar1[1] = (-*pdVar1 * E_Y + E_XY) / (double)*n;
  return pdVar1;
}

Assistant:

double* Numerary::linear_regression(double *X, double *Y, const int& n) {
        int i;
        double E_X = 0, E_Y = 0, E_XY = 0, E_X2 = 0, *ab = new double[2];

        for (i = 0; i < n; i++) {
            E_X     += X[i]; // Mathematical Expectation of X
            E_X2    += (X[i]*X[i]); // Mathematical Expectation of X^2
            E_Y     += Y[i]; // Mathematical Expectation of Y
            E_XY    += (X[i]*Y[i]); // Mathematical Expectation of X*Y
        }

        // Calculating coefficients of line (y = a*x + b)
        ab[0] = (n*E_XY - E_X*E_Y) / (n*E_X2 - E_X*E_X); // a
        ab[1] = (E_Y - ab[0]*E_X) / ((double) n); // b
        
        return ab;
    }